

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cascade.h
# Opt level: O0

void __thiscall
Iir::CascadeStages<3,_Iir::DirectFormII>::setup
          (CascadeStages<3,_Iir::DirectFormII> *this,double (*sosCoefficients) [3] [6])

{
  double in_RSI;
  double in_RDI;
  double unaff_retaddr;
  double in_stack_00000008;
  Biquad *in_stack_00000010;
  int i;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar1;
  double a2;
  
  a2 = in_RDI;
  for (iVar1 = 0; iVar1 < 3; iVar1 = iVar1 + 1) {
    Biquad::setCoefficients
              (in_stack_00000010,in_stack_00000008,unaff_retaddr,a2,in_RSI,
               (double)CONCAT44(iVar1,in_stack_ffffffffffffffe8),in_RDI);
  }
  return;
}

Assistant:

void setup (const double (&sosCoefficients)[MaxStages][6]) {
                for (int i = 0; i < MaxStages; i++) {
                        m_stages[i].setCoefficients(
                                sosCoefficients[i][3],
                                sosCoefficients[i][4],
                                sosCoefficients[i][5],
                                sosCoefficients[i][0],
                                sosCoefficients[i][1],
                                sosCoefficients[i][2]);
                }
        }